

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWIAnalyzerResults.cpp
# Opt level: O3

void __thiscall
AtmelSWIAnalyzerResults::GenerateFrameTabularText
          (AtmelSWIAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texts;
  Frame f;
  char number_str [128];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  Frame local_d0 [16];
  ulong local_c0;
  undefined1 local_b0;
  char local_a8 [136];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_d0);
  switch(local_b0) {
  case 0:
    if (2 < local_c0) goto switchD_0010b8ca_default;
    pcVar1 = &DAT_0010e100 + *(int *)(&DAT_0010e100 + local_c0 * 4);
    break;
  case 1:
    pcVar1 = local_a8;
    AnalyzerHelpers::GetNumberString(local_c0,display_base,8,pcVar1,0x80);
    break;
  case 2:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,8,local_a8,0x80);
    pcVar1 = "Bad Flag (";
    goto LAB_0010b97c;
  case 3:
    AnalyzerHelpers::GetNumberString(local_c0,display_base,8,local_a8,0x80);
    pcVar1 = "Count (";
LAB_0010b97c:
    AnalyzerResults::AddTabularText((char *)this,pcVar1,local_a8,")",(char *)0x0,(char *)0x0);
    goto switchD_0010b8ca_default;
  case 4:
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetTextsForChecksumFrame(local_d0,display_base,&local_e8);
    AnalyzerResults::AddTabularText
              ((char *)this,
               ((local_e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,(char *)0x0,
               (char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_0010ba25;
  case 5:
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetTextsForPacketSegmentFrame(this,local_d0,display_base,&local_e8);
    AnalyzerResults::AddTabularText
              ((char *)this,
               ((local_e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,(char *)0x0,
               (char *)0x0,(char *)0x0,(char *)0x0);
LAB_0010ba25:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
  default:
    goto switchD_0010b8ca_default;
  }
  AnalyzerResults::AddTabularText
            ((char *)this,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
switchD_0010b8ca_default:
  Frame::~Frame(local_d0);
  return;
}

Assistant:

void AtmelSWIAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    /*Frame frame = GetFrame(frame_index);
    ClearResultStrings();

    char number_str[128];
    AnalyzerHelpers::GetNumberString(frame.mData1, display_base, 8, number_str, sizeof(number_str));
    AddResultString(number_str);*/

    ClearTabularText();

    const int BUFF_SIZE = 128;
    char number_str[ BUFF_SIZE ];

    Frame f = GetFrame( frame_index );

    if( f.mType == FrameToken )
    {
        if( f.mData1 == SWI_Wake )
        {
            AddTabularText( "Token Wake" );
        }
        else if( f.mData1 == SWI_One )
        {
            AddTabularText( "Token One" );
        }
        else if( f.mData1 == SWI_Zero )
        {
            AddTabularText( "Token Zero" );
        }
    }
    else if( f.mType == FrameByte )
    {
        AnalyzerHelpers::GetNumberString( f.mData1, display_base, 8, number_str, BUFF_SIZE );
        AddTabularText( number_str );
    }
    else if( f.mType == FrameChecksum )
    {
        std::vector<std::string> texts;
        GetTextsForChecksumFrame( f, display_base, texts );

        AddTabularText( texts[ 0 ].c_str() );
    }
    else if( f.mType == FrameFlag )
    {
        AnalyzerHelpers::GetNumberString( f.mData1, display_base, 8, number_str, BUFF_SIZE );
        AddTabularText( "Bad Flag (", number_str, ")" );
    }
    else if( f.mType == FrameCount )
    {
        AnalyzerHelpers::GetNumberString( f.mData1, display_base, 8, number_str, BUFF_SIZE );
        AddTabularText( "Count (", number_str, ")" );
    }
    else if( f.mType == FramePacketSegment )
    {
        std::vector<std::string> texts;
        GetTextsForPacketSegmentFrame( f, display_base, texts );
        AddTabularText( texts[ 0 ].c_str() );
    }
}